

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

void __thiscall
kratos::PortBundleDefinition::add_definition
          (PortBundleDefinition *this,string *name,uint32_t width,uint32_t size,bool is_signed,
          PortDirection direction,PortType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  PortDirection PVar1;
  iterator iVar2;
  UserException *pUVar3;
  undefined7 in_register_00000081;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>,_bool>
  pVar4;
  undefined1 local_70 [8];
  _Head_base<2UL,_bool,_false> local_68;
  _Head_base<1UL,_unsigned_int,_false> local_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  PortDirection local_44;
  uint32_t local_40;
  undefined4 local_3c;
  allocator<char> local_35;
  uint32_t local_34;
  
  local_50 = name;
  local_44 = direction;
  local_34 = size;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
          ::find(&(this->definitions_)._M_t,name);
  PVar1 = local_44;
  __args = local_50;
  if ((_Rb_tree_header *)iVar2._M_node != &(this->definitions_)._M_t._M_impl.super__Rb_tree_header)
  {
    pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   local_50," already exists");
    UserException::UserException(pUVar3,(string *)local_70);
    __cxa_throw(pUVar3,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70._0_4_ = type;
  local_70._4_4_ = local_44;
  local_3c = (undefined4)CONCAT71(in_register_00000081,is_signed);
  local_64._M_head_impl = local_34;
  local_68._M_head_impl = is_signed;
  local_60._M_allocated_capacity._0_4_ = width;
  local_40 = width;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
                      *)&this->definitions_,local_50,
                     (tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>
                      *)local_70);
  if (PVar1 == In) {
    local_70._4_4_ = Out;
  }
  else {
    if (local_44 != Out) {
      pUVar3 = (UserException *)__cxa_allocate_exception(0x10,__args,pVar4._8_8_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,"PortBundle doesn\'t allow inout",&local_35);
      UserException::UserException(pUVar3,(string *)local_70);
      __cxa_throw(pUVar3,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_70._4_4_ = In;
  }
  local_70._0_4_ = type;
  local_68._M_head_impl = SUB41(local_3c,0);
  local_64._M_head_impl = local_34;
  local_60._M_allocated_capacity._0_4_ = local_40;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
              *)&this->flipped_definitions_,__args,
             (tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType> *)
             local_70);
  return;
}

Assistant:

void PortBundleDefinition::add_definition(const std::string& name, uint32_t width, uint32_t size,
                                          bool is_signed, kratos::PortDirection direction,
                                          kratos::PortType type) {
    if (definitions_.find(name) != definitions_.end())
        throw UserException(name + " already exists");
    definitions_.emplace(name, std::make_tuple(width, size, is_signed, direction, type));
    PortDirection dir;
    if (direction == PortDirection::In) {
        dir = PortDirection::Out;
    } else if (direction == PortDirection::Out) {
        dir = PortDirection::In;
    } else {
        throw UserException("PortBundle doesn't allow inout");
    }
    flipped_definitions_.emplace(name, std::make_tuple(width, size, is_signed, dir, type));
}